

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O1

void __thiscall
test_adjacency_graph_edge_list_construction_Test::~test_adjacency_graph_edge_list_construction_Test
          (test_adjacency_graph_edge_list_construction_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_adjacency_graph, edge_list_construction) {

  Adjacency_Graph<false> graph = create_graph_hybrid();

  EXPECT_EQ(graph.size_vertex(), 8);
  EXPECT_EQ(graph.size_edge(), 12);

  EXPECT_EQ(graph[0].size(), 2);
  EXPECT_EQ(graph[1].size(), 3);
  EXPECT_EQ(graph[2].size(), 2);
  EXPECT_EQ(graph[3].size(), 3);
  EXPECT_EQ(graph[4].size(), 5);
  EXPECT_EQ(graph[5].size(), 3);
  EXPECT_EQ(graph[6].size(), 3);
  EXPECT_EQ(graph[7].size(), 3);

  EXPECT_EQ(graph[0][0], 1);
  EXPECT_EQ(graph[0][1], 3);

  EXPECT_EQ(graph[1][0], 0);
  EXPECT_EQ(graph[1][1], 2);
  EXPECT_EQ(graph[1][2], 4);

  EXPECT_EQ(graph[2][0], 1);
  EXPECT_EQ(graph[2][1], 5);

  EXPECT_EQ(graph[3][0], 0);
  EXPECT_EQ(graph[3][1], 4);
  EXPECT_EQ(graph[3][2], 6);

  EXPECT_EQ(graph[4][0], 1);
  EXPECT_EQ(graph[4][1], 3);
  EXPECT_EQ(graph[4][2], 5);
  EXPECT_EQ(graph[4][3], 6);
  EXPECT_EQ(graph[4][4], 7);

  EXPECT_EQ(graph[5][0], 2);
  EXPECT_EQ(graph[5][1], 4);
  EXPECT_EQ(graph[5][2], 7);

  EXPECT_EQ(graph[6][0], 3);
  EXPECT_EQ(graph[6][1], 4);
  EXPECT_EQ(graph[6][2], 7);

  EXPECT_EQ(graph[7][0], 4);
  EXPECT_EQ(graph[7][1], 5);
  EXPECT_EQ(graph[7][2], 6);
}